

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall TestSuite::readyTest(TestSuite *this,string *test_name)

{
  undefined8 uVar1;
  string *this_00;
  string *in_RSI;
  byte *in_RDI;
  
  uVar1 = std::__cxx11::string::c_str();
  printf("[ .... ] %s\n",uVar1);
  if ((((*in_RDI & 1) != 0) || ((in_RDI[0x3c] & 1) != 0)) && ((in_RDI[0x3b] & 1) == 0)) {
    printf("\x1b[1;30m   === TEST MESSAGE (BEGIN) ===\n\x1b[0m");
  }
  fflush(_stdout);
  this_00 = getTestName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this_00,in_RSI);
  uVar1 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)(in_RDI + 0x48) = uVar1;
  return;
}

Assistant:

void readyTest(const std::string& test_name) {
        printf("[ " "...." " ] %s\n", test_name.c_str());
        if ( (options.printTestMessage || displayMsg) &&
             !suppressMsg ) {
            printf(_CL_D_GRAY("   === TEST MESSAGE (BEGIN) ===\n"));
        }
        fflush(stdout);

        getTestName() = test_name;
        startTimeLocal = std::chrono::system_clock::now();
    }